

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.c
# Opt level: O0

void __thiscall Sparse_matrix_to_QMatrix(void *this,QMatrix *qmatrix)

{
  uint uVar1;
  uint uVar2;
  uint position;
  uint row_length;
  uint index;
  uint row;
  QMatrix *qmatrix_local;
  Sparse_matrix *this_local;
  
  for (row_length = 0; row_length < *this; row_length = row_length + 1) {
    uVar1 = *(int *)(*(long *)((long)this + 8) + (ulong)(row_length + 1) * 4) -
            *(int *)(*(long *)((long)this + 8) + (ulong)row_length * 4);
    Q_SetLen(qmatrix,(ulong)(row_length + 1),(ulong)(uVar1 + 1));
    Q_SetEntry(qmatrix,(ulong)(row_length + 1),0,(ulong)(row_length + 1),
               *(Real *)(*(long *)((long)this + 0x10) + (ulong)row_length * 8));
    for (position = 0; position < uVar1; position = position + 1) {
      uVar2 = *(int *)(*(long *)((long)this + 8) + (ulong)row_length * 4) + position;
      Q_SetEntry(qmatrix,(ulong)(row_length + 1),(ulong)(position + 1),
                 (ulong)(*(int *)(*(long *)((long)this + 8) + (ulong)uVar2 * 4) + 1),
                 *(Real *)(*(long *)((long)this + 0x10) + (ulong)uVar2 * 8));
    }
  }
  return;
}

Assistant:

void Sparse_matrix_to_QMatrix (
    Sparse_matrix const * this,
    QMatrix * qmatrix) {

  register unsigned row, index, row_length, position;

  for (row = 0; row < this->size; ++row) {
    row_length = this->indices[row + 1] - this->indices[row];
    Q_SetLen (qmatrix, row + 1, row_length + 1);
    Q_SetEntry (qmatrix, row + 1, 0, row + 1, this->elements[row]);
    for (index = 0; index < row_length; ++index) {
      position = this->indices[row] + index;
      Q_SetEntry (qmatrix, row + 1, index + 1, this->indices[position] + 1, this->elements[position]);
    }
  }
}